

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

int __thiscall
glslang::TReflectionTraverser::countAggregateMembers(TReflectionTraverser *this,TType *parentType)

{
  EShReflectionOptions EVar1;
  pointer pTVar2;
  TType *parentType_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  TTypeList *pTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t i;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  iVar4 = (*parentType->_vptr_TType[0x25])(parentType);
  if ((char)iVar4 == '\0') {
    iVar4 = 1;
  }
  else {
    EVar1 = this->reflection->options;
    iVar4 = (*parentType->_vptr_TType[7])(parentType);
    bVar10 = true;
    if (iVar4 == 0x10) {
      iVar4 = (*parentType->_vptr_TType[0xb])(parentType);
      bVar10 = (*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 6;
    }
    pTVar7 = TType::getStruct(parentType);
    lVar9 = 0;
    iVar4 = 0;
    for (uVar8 = 0;
        pTVar2 = (pTVar7->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(pTVar7->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ).
                              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5);
        uVar8 = uVar8 + 1) {
      parentType_00 = *(TType **)((long)&pTVar2->type + lVar9);
      iVar5 = countAggregateMembers(this,parentType_00);
      iVar6 = (*parentType_00->_vptr_TType[0x1d])(parentType_00);
      if ((char)iVar6 != '\0') {
        iVar6 = (*parentType_00->_vptr_TType[0x13])(parentType_00);
        bVar3 = TArraySizes::hasUnsized((TArraySizes *)CONCAT44(extraout_var_00,iVar6));
        if (!bVar3) {
          iVar6 = (*parentType_00->_vptr_TType[0x25])(parentType_00);
          if ((byte)((byte)iVar6 &
                    ((EVar1 & EShReflectionStrictArraySuffix) == EShReflectionDefault | bVar10)) ==
              1) {
            iVar6 = (*parentType_00->_vptr_TType[0x13])(parentType_00);
            iVar6 = TArraySizes::getCumulativeSize((TArraySizes *)CONCAT44(extraout_var_01,iVar6));
            iVar5 = iVar5 * iVar6;
          }
        }
      }
      iVar4 = iVar4 + iVar5;
      lVar9 = lVar9 + 0x20;
    }
  }
  return iVar4;
}

Assistant:

int countAggregateMembers(const TType& parentType)
    {
        if (! parentType.isStruct())
            return 1;

        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        bool blockParent = (parentType.getBasicType() == EbtBlock && parentType.getQualifier().storage == EvqBuffer);

        const TTypeList &memberList = *parentType.getStruct();

        int ret = 0;

        for (size_t i = 0; i < memberList.size(); i++)
        {
            const TType &memberType = *memberList[i].type;
            int numMembers = countAggregateMembers(memberType);
            // for sized arrays of structs, apply logic to expand out the same as we would below in
            // blowUpActiveAggregate
            if (memberType.isArray() && ! memberType.getArraySizes()->hasUnsized() && memberType.isStruct()) {
                if (! strictArraySuffix || ! blockParent)
                    numMembers *= memberType.getArraySizes()->getCumulativeSize();
            }
            ret += numMembers;
        }

        return ret;
    }